

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_EvalObject(JSContext *ctx,JSValue this_obj,JSValue val,int flags,int scope_idx)

{
  char *input;
  ulong uVar1;
  JSRefCountHeader *p;
  JSValue JVar2;
  size_t len;
  
  if ((uint)val.tag == 0xfffffff9) {
    input = JS_ToCStringLen(ctx,&len,val);
    if (input == (char *)0x0) {
      val = (JSValue)(ZEXT816(6) << 0x40);
      uVar1 = 0;
      goto LAB_00130efe;
    }
    val = JS_EvalInternal(ctx,this_obj,input,len,"<input>",flags,scope_idx);
    JS_FreeCString(ctx,input);
  }
  else if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  uVar1 = (ulong)val.u.ptr & 0xffffffff00000000;
LAB_00130efe:
  JVar2.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar1);
  JVar2.tag = val.tag;
  return JVar2;
}

Assistant:

static JSValue JS_EvalObject(JSContext *ctx, JSValueConst this_obj,
                             JSValueConst val, int flags, int scope_idx)
{
    JSValue ret;
    const char *str;
    size_t len;

    if (!JS_IsString(val))
        return JS_DupValue(ctx, val);
    str = JS_ToCStringLen(ctx, &len, val);
    if (!str)
        return JS_EXCEPTION;
    ret = JS_EvalInternal(ctx, this_obj, str, len, "<input>", flags, scope_idx);
    JS_FreeCString(ctx, str);
    return ret;

}